

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapped_env.cpp
# Opt level: O1

void __thiscall
so_5::wrapped_env_t::wrapped_env_t
          (wrapped_env_t *this,generic_simple_init_t *init_func,
          generic_simple_so_env_params_tuner_t *params_tuner)

{
  _Manager_type p_Var1;
  _Any_data local_158;
  _Manager_type local_148;
  _Invoker_type local_140;
  _Any_data local_138;
  _Manager_type local_128;
  _Invoker_type local_120;
  environment_params_t local_110;
  
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_128 = (_Manager_type)0x0;
  local_120 = init_func->_M_invoker;
  p_Var1 = (init_func->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_138._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(init_func->super__Function_base)._M_functor;
    local_138._8_8_ = *(undefined8 *)((long)&(init_func->super__Function_base)._M_functor + 8);
    (init_func->super__Function_base)._M_manager = (_Manager_type)0x0;
    init_func->_M_invoker = (_Invoker_type)0x0;
    local_128 = p_Var1;
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_148 = (_Manager_type)0x0;
  local_140 = params_tuner->_M_invoker;
  p_Var1 = (params_tuner->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_158._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(params_tuner->super__Function_base)._M_functor;
    local_158._8_8_ = *(undefined8 *)((long)&(params_tuner->super__Function_base)._M_functor + 8);
    *(undefined1 (*) [16])&(params_tuner->super__Function_base)._M_manager = ZEXT816(0) << 0x20;
    local_148 = p_Var1;
  }
  environment_params_t::environment_params_t(&local_110);
  if (local_148 != (_Manager_type)0x0) {
    (*local_140)(&local_158,&local_110);
    wrapped_env_t(this,(generic_simple_init_t *)&local_138,&local_110);
    environment_params_t::~environment_params_t(&local_110);
    if (local_148 != (_Manager_type)0x0) {
      (*local_148)(&local_158,&local_158,__destroy_functor);
    }
    if (local_128 != (_Manager_type)0x0) {
      (*local_128)(&local_138,&local_138,__destroy_functor);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

wrapped_env_t::wrapped_env_t(
	so_5::api::generic_simple_init_t init_func,
	so_5::api::generic_simple_so_env_params_tuner_t params_tuner )
	:	wrapped_env_t{
			std::move( init_func ),
			make_params_via_tuner( std::move( params_tuner ) ) }
	{}